

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  string *psVar3;
  long lVar4;
  double dVar5;
  allocator local_10ea;
  allocator local_10e9;
  Company c;
  Boss b;
  Address a;
  Employee e1;
  Address a1;
  Employee e4;
  Employee e3;
  Employee e2;
  Employee local_c68;
  Employee local_bb0;
  Employee local_af8;
  Employee local_a40;
  Employee local_988;
  Employee local_8d0;
  Employee local_818;
  Employee local_760;
  Employee local_6a8;
  Employee local_5f0;
  Employee e10;
  Employee e9;
  Employee e8;
  Employee e7;
  Employee e6;
  Employee e5;
  Boss local_e0;
  
  std::__cxx11::string::string((string *)&local_c68,"iran",(allocator *)&e2);
  std::__cxx11::string::string((string *)&b,"babol",(allocator *)&e3);
  std::__cxx11::string::string((string *)&e1,"meraj",(allocator *)&e4);
  Address::Address(&a,(string *)&local_c68,(string *)&b,(string *)&e1);
  std::__cxx11::string::~string((string *)&e1);
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::string((string *)&local_c68,"iran",(allocator *)&e2);
  std::__cxx11::string::string((string *)&b,"tehran",(allocator *)&e3);
  std::__cxx11::string::string((string *)&e1,"valiasr",(allocator *)&e4);
  Address::Address(&a1,(string *)&local_c68,(string *)&b,(string *)&e1);
  std::__cxx11::string::~string((string *)&e1);
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::string((string *)&local_c68,"s",(allocator *)&e2);
  std::__cxx11::string::string((string *)&b,"99*ab11789",(allocator *)&e3);
  Employee::Employee(&e1,(string *)&local_c68,(string *)&b,&a,2,10,4,2);
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::string((string *)&local_c68,"d",(allocator *)&e3);
  std::__cxx11::string::string((string *)&b,"87*ab11789",(allocator *)&e4);
  Employee::Employee(&e2,(string *)&local_c68,(string *)&b,&a1,2,10,4,2);
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::string((string *)&local_c68,"f",(allocator *)&e4);
  std::__cxx11::string::string((string *)&b,"91*ab11789",(allocator *)&e5);
  Employee::Employee(&e3,(string *)&local_c68,(string *)&b,&a,2,10,4,2);
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::string((string *)&local_c68,"g",(allocator *)&e5);
  std::__cxx11::string::string((string *)&b,"97*ab23789",(allocator *)&e6);
  Employee::Employee(&e4,(string *)&local_c68,(string *)&b,&a,2,10,4,3);
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::string((string *)&local_c68,"j",(allocator *)&e6);
  std::__cxx11::string::string((string *)&b,"91*sd11789",(allocator *)&e7);
  Employee::Employee(&e5,(string *)&local_c68,(string *)&b,&a,2,10,4,2);
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::string((string *)&local_c68,"r",(allocator *)&e7);
  std::__cxx11::string::string((string *)&b,"91*a11789",(allocator *)&e8);
  Employee::Employee(&e6,(string *)&local_c68,(string *)&b,&a,2,10,4,2);
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::string((string *)&local_c68,"k",(allocator *)&e8);
  std::__cxx11::string::string((string *)&b,"95*we01789",(allocator *)&e9);
  Employee::Employee(&e7,(string *)&local_c68,(string *)&b,&a,2,10,4,2);
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::string((string *)&local_c68,"a",(allocator *)&e9);
  std::__cxx11::string::string((string *)&b,"94*ab11989",(allocator *)&e10);
  Employee::Employee(&e8,(string *)&local_c68,(string *)&b,&a,2,10,4,2);
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::string((string *)&local_c68,"c",(allocator *)&e10);
  std::__cxx11::string::string((string *)&b,"89*ab11189",(allocator *)&c);
  Employee::Employee(&e9,(string *)&local_c68,(string *)&b,&a,2,10,4,2);
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::string((string *)&local_c68,"x",(allocator *)&c);
  std::__cxx11::string::string((string *)&b,"86*a11789",&local_10ea);
  Employee::Employee(&e10,(string *)&local_c68,(string *)&b,&a1,2,10,4,2);
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::string((string *)&local_c68,"sam",&local_10ea);
  std::__cxx11::string::string((string *)&c,"89*ab11789",&local_10e9);
  Boss::Boss(&b,(string *)&local_c68,(string *)&c,&a,2,10,4,2,10);
  std::__cxx11::string::~string((string *)&c);
  std::__cxx11::string::~string((string *)&local_c68);
  Employee::Employee(&local_c68,&e1);
  Employee::Employee(&local_bb0,&e2);
  Employee::Employee(&local_af8,&e3);
  Employee::Employee(&local_a40,&e4);
  Employee::Employee(&local_988,&e5);
  Employee::Employee(&local_8d0,&e6);
  Employee::Employee(&local_818,&e7);
  Employee::Employee(&local_760,&e8);
  Employee::Employee(&local_6a8,&e9);
  Employee::Employee(&local_5f0,&e10);
  poVar2 = std::operator<<((ostream *)&std::cout,'e');
  psVar3 = Person::getId_abi_cxx11_(&e1.super_Person);
  std::operator<<(poVar2,*(psVar3->_M_dataplus)._M_p);
  Boss::Boss(&local_e0,&b);
  Company::Company(&c,0x315,&local_e0,&local_c68);
  Person::~Person((Person *)&local_e0);
  iVar1 = Company::getBudget(&c);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  Company::setBudget(&c,0x381);
  iVar1 = Company::getBudget(&c);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  dVar5 = Company::averageEfficiency(&c);
  poVar2 = std::ostream::_M_insert<double>(dVar5);
  std::endl<char,std::char_traits<char>>(poVar2);
  Company::gift(&c);
  iVar1 = Employee::getHourWork(&local_bb0);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  poVar2 = std::operator<<(poVar2,"\t");
  iVar1 = Employee::getHourWork(&local_5f0);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"\t");
  iVar1 = Employee::getHourWork(&local_a40);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"\t");
  std::endl<char,std::char_traits<char>>(poVar2);
  Company::payForService(&c);
  iVar1 = Employee::getHourWork(&local_bb0);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  poVar2 = std::operator<<(poVar2,"\t");
  iVar1 = Employee::getHourWork(&local_5f0);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"\t");
  iVar1 = Employee::getHourWork(&local_a40);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"\t");
  std::endl<char,std::char_traits<char>>(poVar2);
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) | 1;
  Company::isEnoughBudget(&c);
  std::ostream::_M_insert<bool>(true);
  Company::~Company(&c);
  lVar4 = 0x678;
  do {
    Person::~Person((Person *)((long)&local_c68.super_Person._vptr_Person + lVar4));
    lVar4 = lVar4 + -0xb8;
  } while (lVar4 != -0xb8);
  Person::~Person((Person *)&b);
  Person::~Person(&e10.super_Person);
  Person::~Person(&e9.super_Person);
  Person::~Person(&e8.super_Person);
  Person::~Person(&e7.super_Person);
  Person::~Person(&e6.super_Person);
  Person::~Person(&e5.super_Person);
  Person::~Person(&e4.super_Person);
  Person::~Person(&e3.super_Person);
  Person::~Person(&e2.super_Person);
  Person::~Person(&e1.super_Person);
  Address::~Address(&a1);
  Address::~Address(&a);
  return 0;
}

Assistant:

int main() {

    /*
    Address a0("", "", "");
    cin >> a0;
    cout << a0 << endl;
    Person p0("e", "91qef12389", a0);
    cin >> p0;
    cout << p0 << endl;
    p0.setName("ali");
    cout << p0.getName() << endl;
    Employee e0("sma", "98*ab11789", a0, 8,30,4,1);
    cout << e0.calculateSalary() << endl;
    cout << e0.efficiency() << endl;
    cout << e0;
     */
    //and ... (other functions & ...)

    //Company build
    Address a("iran", "babol", "meraj");
    Address a1("iran", "tehran", "valiasr");
    Employee e1("s", "99*ab11789", a, 2,10,4,2);
    Employee e2("d", "87*ab11789", a1, 2,10,4,2);
    Employee e3("f", "91*ab11789", a, 2,10,4,2);
    Employee e4("g", "97*ab23789", a, 2,10,4,3);
    Employee e5("j", "91*sd11789", a, 2,10,4,2);
    Employee e6("r", "91*a11789", a, 2,10,4,2);
    Employee e7("k", "95*we01789", a, 2,10,4,2);
    Employee e8("a", "94*ab11989", a, 2,10,4,2);
    Employee e9("c", "89*ab11189", a, 2,10,4,2);
    Employee e10("x", "86*a11789", a1, 2,10,4,2);
    Boss b("sam", "89*ab11789", a, 2,10,4,2,10);
    Employee e[] = {e1, e2, e3, e4, e5, e6, e7, e8, e9, e10};
    cout << 'e' << e1.getId()[0];
    Company c(789,b,e);
    cout << c.getBudget() << endl;
    c.setBudget(897);
    cout << c.getBudget() << endl;
//    cout << c.maxEfficiency() << endl;
    cout << c.averageEfficiency() << endl;
    c.gift();
    cout << e[1].getHourWork() << "\t" << e[9].getHourWork() << "\t" << e[3].getHourWork() << "\t" << endl;
    c.payForService();
    cout << e[1].getHourWork() << "\t" << e[9].getHourWork() << "\t" << e[3].getHourWork() << "\t" << endl;
    cout << boolalpha << c.isEnoughBudget();



    return 0;
}